

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O0

base_learner * active_cover_setup(options_i *options,vw *all)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *plVar4;
  byte bVar5;
  pointer paVar6;
  undefined8 uVar7;
  ulong uVar8;
  float *pfVar9;
  learner<active_cover,_example> *base_00;
  vw *in_RSI;
  long *in_RDI;
  learner<active_cover,_example> *l;
  size_t i;
  single_learner *base;
  stringstream __msg_1;
  stringstream __msg;
  bool active_cover_option;
  option_group_definition new_options;
  free_ptr<active_cover> data;
  typed_option<float> *in_stack_fffffffffffff0a8;
  vw *in_stack_fffffffffffff0b0;
  string *in_stack_fffffffffffff0b8;
  _func_void_active_cover_ptr_learner<char,_example>_ptr_example_ptr *predict;
  typed_option<float> *in_stack_fffffffffffff0c0;
  string *in_stack_fffffffffffff0c8;
  undefined8 in_stack_fffffffffffff0d0;
  int plineNumber;
  learner<active_cover,_example> *this;
  char *in_stack_fffffffffffff0d8;
  vw_exception *in_stack_fffffffffffff0e0;
  typed_option<float> *in_stack_fffffffffffff0f8;
  option_group_definition *in_stack_fffffffffffff100;
  learner<active_cover,_example> *local_db8;
  learner<char,_char> *in_stack_fffffffffffff270;
  stringstream local_d80 [16];
  ostream local_d70;
  allocator local_bf1;
  string local_bf0 [39];
  undefined1 local_bc9;
  stringstream local_ba8 [16];
  ostream local_b98;
  allocator local_a19;
  string local_a18 [32];
  undefined4 local_9f8;
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [359];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  typed_option<unsigned_long> local_818 [2];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [359];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [359];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [359];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<bool> local_1d8 [2];
  byte local_95;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff0d0 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<active_cover>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Active Learning with Cover",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0b0,
             (string *)in_stack_fffffffffffff0a8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_95 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"active_cover",&local_1f9);
  VW::config::make_option<bool>(in_stack_fffffffffffff0b8,(bool *)in_stack_fffffffffffff0b0);
  VW::config::typed_option<bool>::keep(local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"enable active learning with cover",&local_221);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff0b0,(string *)in_stack_fffffffffffff0a8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff0b0,
             (typed_option<bool> *)in_stack_fffffffffffff0a8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff100,(typed_option<bool> *)in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"mellowness",&local_389);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316186);
  VW::config::make_option<float>(in_stack_fffffffffffff0b8,(float *)in_stack_fffffffffffff0b0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff0c0,(float)((ulong)in_stack_fffffffffffff0b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b0,"active learning mellowness parameter c_0. Default 8.",&local_3b1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff0b0,(string *)in_stack_fffffffffffff0a8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"alpha",&local_519);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316287);
  VW::config::make_option<float>(in_stack_fffffffffffff0b8,(float *)in_stack_fffffffffffff0b0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff0c0,(float)((ulong)in_stack_fffffffffffff0b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_540,"active learning variance upper bound parameter alpha. Default 1.",&local_541
            );
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff0b0,(string *)in_stack_fffffffffffff0a8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"beta_scale",&local_6a9);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x31638c);
  VW::config::make_option<float>(in_stack_fffffffffffff0b8,(float *)in_stack_fffffffffffff0b0);
  sqrtf(10.0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff0c0,(float)((ulong)in_stack_fffffffffffff0b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6d0,
             "active learning variance upper bound parameter beta_scale. Default sqrt(10).",
             &local_6d1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff0b0,(string *)in_stack_fffffffffffff0a8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"cover",&local_839);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316496);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff0b8,(unsigned_long *)in_stack_fffffffffffff0b0);
  VW::config::typed_option<unsigned_long>::keep(local_818,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0c0,
             (unsigned_long)in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"cover size. Default 12.",&local_861);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0b0,
             (string *)in_stack_fffffffffffff0a8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0b0,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff0a8);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff100,(typed_option<unsigned_long> *)in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"oracular",&local_9c9);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x3165b4);
  VW::config::make_option<bool>(in_stack_fffffffffffff0b8,(bool *)in_stack_fffffffffffff0b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9f0,"Use Oracular-CAL style query or not. Default false.",&local_9f1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff0b0,(string *)in_stack_fffffffffffff0a8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff0b0,
             (typed_option<bool> *)in_stack_fffffffffffff0a8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff100,(typed_option<bool> *)in_stack_fffffffffffff0f8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_10)(local_10,local_60);
  if ((local_95 & 1) == 0) {
    local_8 = (vw *)0x0;
  }
  else {
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316e1f);
    paVar6->all = local_18;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316e38);
    fVar1 = paVar6->beta_scale;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316e53);
    paVar6->beta_scale = fVar1 * paVar6->beta_scale;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316e73);
    if ((paVar6->oracular & 1U) != 0) {
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x316e86);
      paVar6->cover_size = 0;
    }
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a18,"lda",&local_a19);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_a18);
    std::__cxx11::string::~string(local_a18);
    std::allocator<char>::~allocator((allocator<char> *)&local_a19);
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_ba8);
      std::operator<<(&local_b98,"error: you can\'t combine lda and active learning");
      local_bc9 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,plineNumber,
                 in_stack_fffffffffffff0c8);
      local_bc9 = 0;
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_bf0,"active",&local_bf1);
    bVar5 = (**(code **)(*local_10 + 8))(local_10,local_bf0);
    std::__cxx11::string::~string(local_bf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_d80);
      std::operator<<(&local_d70,
                      "error: you can\'t use --active_cover and --active at the same time");
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,plineNumber,
                 in_stack_fffffffffffff0c8);
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    setup_base((options_i *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    in_stack_fffffffffffff0c0 =
         (typed_option<float> *)LEARNER::as_singleline<char,char>(in_stack_fffffffffffff270);
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x317291);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = paVar6->cover_size;
    uVar8 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pfVar9 = (float *)operator_new__(uVar8);
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x3172c9);
    paVar6->lambda_n = pfVar9;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x3172dc);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = paVar6->cover_size;
    uVar8 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pfVar9 = (float *)operator_new__(uVar8);
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x31730f);
    paVar6->lambda_d = pfVar9;
    local_db8 = (learner<active_cover,_example> *)0x0;
    while( true ) {
      this = local_db8;
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x31733e);
      if ((learner<active_cover,_example> *)paVar6->cover_size <= this) break;
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x317359);
      paVar6->lambda_n[(long)local_db8] = 0.0;
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x31737a);
      paVar6->lambda_d[(long)local_db8] = 0.125;
      local_db8 = local_db8 + 1;
    }
    predict = (_func_void_active_cover_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
    std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
              ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x3173cb);
    base_00 = LEARNER::init_learner<active_cover,example,LEARNER::learner<char,example>>
                        ((free_ptr<active_cover> *)this,
                         (learner<char,_example> *)in_stack_fffffffffffff0c8,
                         (_func_void_active_cover_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff0c0,predict,(size_t)in_stack_fffffffffffff0b0);
    LEARNER::learner<active_cover,_example>::set_finish(this,(_func_void_active_cover_ptr *)base_00)
    ;
    in_stack_fffffffffffff0b0 = (vw *)LEARNER::make_base<active_cover,example>(base_00);
    local_8 = in_stack_fffffffffffff0b0;
  }
  local_9f8 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0b0);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)in_stack_fffffffffffff0c0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* active_cover_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active_cover>();
  option_group_definition new_options("Active Learning with Cover");

  bool active_cover_option = false;
  new_options.add(make_option("active_cover", active_cover_option).keep().help("enable active learning with cover"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8."))
      .add(make_option("alpha", data->alpha)
               .default_value(1.f)
               .help("active learning variance upper bound parameter alpha. Default 1."))
      .add(make_option("beta_scale", data->beta_scale)
               .default_value(sqrtf(10.f))
               .help("active learning variance upper bound parameter beta_scale. Default sqrt(10)."))
      .add(make_option("cover", data->cover_size).keep().default_value(12).help("cover size. Default 12."))
      .add(make_option("oracular", data->oracular).help("Use Oracular-CAL style query or not. Default false."));
  options.add_and_parse(new_options);

  if (!active_cover_option)
    return nullptr;

  data->all = &all;
  data->beta_scale *= data->beta_scale;

  if (data->oracular)
    data->cover_size = 0;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --active_cover and --active at the same time");

  auto base = as_singleline(setup_base(options, all));

  data->lambda_n = new float[data->cover_size];
  data->lambda_d = new float[data->cover_size];

  for (size_t i = 0; i < data->cover_size; i++)
  {
    data->lambda_n[i] = 0.f;
    data->lambda_d[i] = 1.f / 8.f;
  }

  // Create new learner
  learner<active_cover, example>& l = init_learner(
      data, base, predict_or_learn_active_cover<true>, predict_or_learn_active_cover<false>, data->cover_size + 1);
  l.set_finish(finish);

  return make_base(l);
}